

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::run
          (UniformLocationCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  TypeComponentVector *pTVar1;
  pointer type;
  undefined1 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  TestLog *pTVar5;
  RenderContext *context;
  byte bVar6;
  PtrData<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> data;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  bool bVar10;
  DataType DVar11;
  int iVar12;
  int iVar13;
  deUint32 dVar14;
  IterateResult extraout_EAX;
  ostream *poVar15;
  size_type sVar16;
  char *pcVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar18;
  size_type sVar19;
  undefined4 extraout_var_02;
  long lVar20;
  undefined4 extraout_var_03;
  Texture2D *this_00;
  undefined8 *puVar21;
  TestError *this_01;
  int iVar22;
  uint uVar23;
  int precision;
  VarType *type_00;
  VarType *type_01;
  VarType *pVVar24;
  int i;
  long lVar25;
  byte bVar26;
  int y;
  uint sizedFormat;
  Precision id;
  qpTestResult testResult;
  string *__k;
  uint uVar27;
  _anonymous_namespace_ *this_02;
  TypeComponentVector *path;
  Precision PVar28;
  uint uVar29;
  int x;
  undefined4 uVar30;
  DeclareVariable *this_03;
  ulong uVar31;
  TypeComponentVector *type_02;
  pointer pUVar32;
  float val;
  UniformLocationCase *pUVar33;
  UniformLocationCase *pUVar34;
  Precision PVar35;
  TypeAccessFormat local_958;
  StructType *structType;
  undefined1 auStack_940 [24];
  float local_928;
  uint uStack_924;
  int iStack_920;
  int iStack_91c;
  allocator<char> local_90a;
  allocator<char> local_909;
  string uniName;
  BasicTypeIterator subTypeIter;
  Surface rendered;
  RandomViewport viewport;
  string layout;
  VarType subType;
  deInt32 intBuf [4];
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  declaredStructs;
  Texture2D *local_710;
  deUint16 indices [6];
  ostringstream vertDecl;
  ostringstream fragMain;
  ostringstream fragDecl;
  ShaderProgram program;
  ProgramSources sources;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragMain);
  poVar15 = std::operator<<(&vertDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                            "#version 310 es\n");
  poVar15 = std::operator<<(poVar15,"precision highp float;\n");
  poVar15 = std::operator<<(poVar15,"precision highp int;\n");
  poVar15 = std::operator<<(poVar15,
                            "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
                           );
  poVar15 = std::operator<<(poVar15,"in highp vec4 a_position;\n");
  std::operator<<(poVar15,"out highp vec4 v_color;\n");
  poVar15 = std::operator<<(&fragDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                            "#version 310 es\n\n");
  poVar15 = std::operator<<(poVar15,"precision highp float;\n");
  poVar15 = std::operator<<(poVar15,"precision highp int;\n");
  poVar15 = std::operator<<(poVar15,
                            "float verify(float val, float ref) { return float(abs(val-ref) < 0.05); }\n\n"
                           );
  poVar15 = std::operator<<(poVar15,"in highp vec4 v_color;\n");
  std::operator<<(poVar15,"layout(location = 0) out mediump vec4 o_color;\n\n");
  poVar15 = std::operator<<((ostream *)&program,"void main()\n{\n");
  poVar15 = std::operator<<(poVar15,"\tgl_Position = a_position;\n");
  std::operator<<(poVar15,"\tv_color = vec4(1.0);\n");
  poVar15 = std::operator<<(&fragMain.super_basic_ostream<char,_std::char_traits<char>_>,
                            "void main()\n{\n");
  std::operator<<(poVar15,"\to_color = v_color;\n");
  declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header;
  declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  declaredStructs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  viewport.x = 0;
  declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       declaredStructs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pUVar32 = (uniformList->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(uniformList->
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar32) / 0x28) <=
        viewport.x) break;
    this_03 = (DeclareVariable *)((long)viewport.x * 0x28);
    uVar27 = *(uint *)((long)&(this_03->name)._M_dataplus._M_p + (long)pUVar32);
    uVar3 = *(undefined8 *)
             ((long)&(this_03->name)._M_dataplus._M_p + (long)&(pUVar32->type).field_0x4);
    local_928 = (float)uVar3;
    uStack_924 = (uint)((ulong)uVar3 >> 0x20);
    iStack_920 = 0;
    iStack_91c = 0;
    if (*(int *)((long)&(this_03->name)._M_string_length + (long)&(pUVar32->type).field_0x4) < 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&layout,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&subTypeIter);
    }
    else {
      de::toString<int>(&uniName,(int *)((long)&(this_03->name)._M_string_length +
                                        (long)&(pUVar32->type).field_0x4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subTypeIter,"layout(location = ",&uniName);
      std::operator+(&layout,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &subTypeIter,") ");
      std::__cxx11::string::~string((string *)&subTypeIter);
      std::__cxx11::string::~string((string *)&uniName);
    }
    de::toString<int>((string *)&subTypeIter,&viewport.x);
    std::operator+(&uniName,"uni",(string *)&subTypeIter);
    pVVar24 = (VarType *)((long)&(this_03->varType).m_type + (long)pUVar32);
    std::__cxx11::string::~string((string *)&subTypeIter);
    PVar28 = pVVar24[1].m_data.basic.precision;
    if (pVVar24->m_type == TYPE_STRUCT) {
      structType = (pVVar24->m_data).structPtr;
      sVar16 = std::
               set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
               ::count(&declaredStructs,&structType);
      if (sVar16 == 0) {
        if ((uVar27 & 1) != 0) {
          subTypeIter.m_type = (VarType *)structType;
          subTypeIter.m_path.
          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          poVar15 = glu::decl::operator<<
                              (&vertDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                               (DeclareStructTypePtr *)&subTypeIter);
          std::operator<<(poVar15,";\n");
        }
        if ((uVar27 & 2) != 0) {
          subTypeIter.m_type = (VarType *)structType;
          subTypeIter.m_path.
          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          poVar15 = glu::decl::operator<<
                              (&fragDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                               (DeclareStructTypePtr *)&subTypeIter);
          std::operator<<(poVar15,";\n");
        }
        std::
        _Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
        ::_M_insert_unique<glu::StructType_const*const&>
                  ((_Rb_tree<glu::StructType_const*,glu::StructType_const*,std::_Identity<glu::StructType_const*>,std::less<glu::StructType_const*>,std::allocator<glu::StructType_const*>>
                    *)&declaredStructs,&structType);
      }
    }
    uVar23 = (uint)local_928 & 1;
    uVar29 = uStack_924 & 1;
    local_928 = (float)-(uint)(((uint)local_928 & 2) == 0);
    uStack_924 = -(uint)((uStack_924 & 2) == 0);
    iStack_920 = -(uint)(uVar23 == 0);
    iStack_91c = -(uint)(uVar29 == 0);
    if ((uVar27 & 1) != 0) {
      poVar15 = std::operator<<(&vertDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                                "uniform ");
      auVar7._4_4_ = uStack_924;
      auVar7._0_4_ = local_928;
      auVar7._8_4_ = iStack_920;
      this_03 = (DeclareVariable *)(ulong)(ushort)iStack_920;
      if ((auVar7 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        std::__cxx11::string::string((string *)&structType,(string *)&layout);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&structType,glcts::fixed_sample_locations_values + 1,&local_909);
      }
      poVar15 = std::operator<<(poVar15,(string *)&structType);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&subTypeIter,pVVar24,&uniName,0);
      poVar15 = glu::decl::operator<<(poVar15,(DeclareVariable *)&subTypeIter);
      std::operator<<(poVar15,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&subTypeIter);
      std::__cxx11::string::~string((string *)&structType);
    }
    if ((uVar27 & 2) != 0) {
      poVar15 = std::operator<<(&fragDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                                "uniform ");
      auVar8._4_4_ = uStack_924;
      auVar8._0_4_ = local_928;
      auVar8._8_4_ = iStack_920;
      if ((auVar8 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        std::__cxx11::string::string((string *)&structType,(string *)&layout);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&structType,glcts::fixed_sample_locations_values + 1,&local_90a);
      }
      poVar15 = std::operator<<(poVar15,(string *)&structType);
      this_03 = (DeclareVariable *)&subTypeIter;
      glu::decl::DeclareVariable::DeclareVariable(this_03,pVVar24,&uniName,0);
      poVar15 = glu::decl::operator<<(poVar15,this_03);
      std::operator<<(poVar15,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&subTypeIter);
      std::__cxx11::string::~string((string *)&structType);
    }
    glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&subTypeIter,pVVar24);
    auVar9._4_4_ = uStack_924;
    auVar9._0_4_ = local_928;
    auVar9._8_4_ = iStack_920;
    auVar9._12_4_ = iStack_91c;
    uVar30 = movmskps((int)this_03,auVar9);
    bVar6 = (byte)uVar30;
    bVar26 = (bVar6 & 2) >> 1;
    PVar35 = PVar28;
    while( true ) {
      auStack_940._8_8_ = (pointer)0x0;
      auStack_940._16_8_ = (pointer)0x0;
      structType = (StructType *)0x0;
      auStack_940._0_4_ = TYPE_INVALID;
      auStack_940._4_4_ = PRECISION_LOWP;
      bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                         (&subTypeIter,(SubTypeIterator<glu::IsBasicType> *)&structType);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    auStack_940);
      if (!bVar10) break;
      glu::getVarType(&subType,pVVar24,&subTypeIter.m_path);
      DVar11 = glu::getDataTypeScalarType(subType.m_data.basic.type);
      pcVar17 = glu::getDataTypeName(DVar11);
      id = ~PRECISION_LOWP;
      if (-1 < (int)PVar35) {
        id = PVar28;
      }
      val = getExpectedValue(DVar11,id,pcVar17);
      de::floatToString_abi_cxx11_((string *)&structType,(de *)0x3,val,precision);
      if (DVar11 - TYPE_SAMPLER_1D < 0x1e) {
        if (bVar6 >> 3 == 0) {
          poVar15 = std::operator<<((ostream *)&program,"\tv_color.rgb *= verify(float( texture(");
          poVar15 = std::operator<<(poVar15,(string *)&uniName);
          rendered.m_pixels.m_ptr = &subTypeIter.m_path;
          rendered._0_8_ = pVVar24;
          poVar15 = glu::operator<<(poVar15,(TypeAccessFormat *)&rendered);
          poVar15 = std::operator<<(poVar15,", vec2(0.5)).r), ");
          poVar15 = std::operator<<(poVar15,(string *)&structType);
          std::operator<<(poVar15,");\n");
        }
        if (bVar26 == 0) {
          poVar15 = std::operator<<(&fragMain.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\to_color.rgb *= verify(float( texture(");
          poVar15 = std::operator<<(poVar15,(string *)&uniName);
          rendered.m_pixels.m_ptr = &subTypeIter.m_path;
          rendered._0_8_ = pVVar24;
          poVar15 = glu::operator<<(poVar15,(TypeAccessFormat *)&rendered);
          poVar15 = std::operator<<(poVar15,", vec2(0.5)).r), ");
          poVar15 = std::operator<<(poVar15,(string *)&structType);
          std::operator<<(poVar15,");\n");
        }
      }
      else {
        if (bVar6 >> 3 == 0) {
          poVar15 = std::operator<<((ostream *)&program,"\tv_color.rgb *= verify(float(");
          poVar15 = std::operator<<(poVar15,(string *)&uniName);
          local_958.path = &subTypeIter.m_path;
          local_958.type = pVVar24;
          poVar15 = glu::operator<<(poVar15,&local_958);
          Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                    ((string *)&rendered,(_anonymous_namespace_ *)&subType,type_00);
          poVar15 = std::operator<<(poVar15,(string *)&rendered);
          poVar15 = std::operator<<(poVar15,"), ");
          poVar15 = std::operator<<(poVar15,(string *)&structType);
          std::operator<<(poVar15,");\n");
          std::__cxx11::string::~string((string *)&rendered);
        }
        if (bVar26 == 0) {
          poVar15 = std::operator<<(&fragMain.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\to_color.rgb *= verify(float(");
          poVar15 = std::operator<<(poVar15,(string *)&uniName);
          local_958.path = &subTypeIter.m_path;
          local_958.type = pVVar24;
          poVar15 = glu::operator<<(poVar15,&local_958);
          Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
                    ((string *)&rendered,(_anonymous_namespace_ *)&subType,type_01);
          poVar15 = std::operator<<(poVar15,(string *)&rendered);
          poVar15 = std::operator<<(poVar15,"), ");
          poVar15 = std::operator<<(poVar15,(string *)&structType);
          std::operator<<(poVar15,");\n");
          std::__cxx11::string::~string((string *)&rendered);
        }
      }
      std::__cxx11::string::~string((string *)&structType);
      glu::VarType::~VarType(&subType);
      glu::SubTypeIterator<glu::IsBasicType>::operator++
                ((SubTypeIterator<glu::IsBasicType> *)intBuf,&subTypeIter,0);
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    (intBuf + 2));
      PVar28 = PVar28 + PRECISION_MEDIUMP;
    }
    std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::~_Vector_base
              (&subTypeIter.m_path.
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>);
    std::__cxx11::string::~string((string *)&uniName);
    std::__cxx11::string::~string((string *)&layout);
    viewport.x = viewport.x + 1;
  }
  std::operator<<((ostream *)&program,"}\n");
  std::operator<<(&fragMain.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subTypeIter,
                 &layout,&uniName);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&structType,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subType);
  glu::makeVtxFragSources(&sources,(string *)&subTypeIter,(string *)&structType);
  std::__cxx11::string::~string((string *)&structType);
  std::__cxx11::string::~string((string *)&subType);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)&subTypeIter);
  std::__cxx11::string::~string((string *)&uniName);
  std::__cxx11::string::~string((string *)&layout);
  std::
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~_Rb_tree(&declaredStructs._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragMain);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertDecl);
  pUVar33 = this;
  glu::ShaderProgram::ShaderProgram(&program,this->m_renderCtx,&sources);
  iVar12 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  iVar13 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar25 = CONCAT44(extraout_var,iVar13);
  iVar13 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar14 = deStringHash((pUVar33->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  path = (TypeComponentVector *)(ulong)(dVar14 + iVar12);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar13),0x10,0x10,dVar14 + iVar12);
  tcu::Surface::Surface(&rendered,0x10,0x10);
  pUVar34 = pUVar33;
  iVar12 = (*pUVar33->m_renderCtx->_vptr_RenderContext[3])();
  dVar14 = program.m_program.m_program;
  bVar10 = ((*program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk;
  bVar4 = ((*program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk;
  pTVar5 = ((pUVar33->super_TestCase).super_TestNode.m_testCtx)->m_log;
  fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (ulong)(uint)fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ << 0x20;
  fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       &fragDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
  local_928 = SUB84(pTVar5,0);
  uStack_924 = (uint)((ulong)pTVar5 >> 0x20);
  uVar30 = extraout_var_01;
  fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
       fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
  glu::operator<<(pTVar5,&program);
  if (((bVar10 == false) || (bVar4 == false)) || (program.m_program.m_info.linkOk == false)) {
    puVar2 = &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
         local_928;
    vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
         uStack_924;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"ERROR: shader failed to compile/link");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    tcu::TestContext::setTestResult
              ((pUVar34->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed to compile/link");
LAB_012d1cdf:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &fragDecl);
  }
  else {
    uVar31 = 0;
    while( true ) {
      pUVar32 = (uniformList->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(int)(((long)(uniformList->
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar32) / 0x28) <=
          (long)uVar31) break;
      pUVar32 = pUVar32 + uVar31;
      glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)&fragMain,&pUVar32->type);
      iVar13 = 0;
      while( true ) {
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0.0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0;
        bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                           ((SubTypeIterator<glu::IsBasicType> *)&fragMain,
                            (SubTypeIterator<glu::IsBasicType> *)&vertDecl);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
        if (!bVar10) break;
        Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                  ((string *)&subTypeIter,(_anonymous_namespace_ *)(uVar31 & 0xffffffff),
                   (int)pUVar32,
                   (VarType *)&fragMain.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                   ,path);
        layout._M_dataplus._M_p._0_4_ =
             (**(code **)(CONCAT44(uVar30,iVar12) + 0xb48))(dVar14,subTypeIter.m_type);
        iVar22 = pUVar32->location + iVar13;
        if (pUVar32->location < 0) {
          iVar22 = -1;
        }
        uniName._M_dataplus._M_p._0_4_ = iVar22;
        if (iVar22 < 0) {
          if (-1 < (int)layout._M_dataplus._M_p) {
            sVar19 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&fragDecl,
                                (key_type_conflict *)&layout);
            __k = &layout;
            if (sVar19 != 0) {
              puVar2 = &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
              vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_
                   = local_928;
              vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_
                   = uStack_924;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
              std::operator<<((ostream *)puVar2,"ERROR: found uniform ");
              std::operator<<((ostream *)puVar2,(string *)&subTypeIter);
              std::operator<<((ostream *)puVar2," in location ");
              std::ostream::operator<<(puVar2,(int)layout._M_dataplus._M_p);
              std::operator<<((ostream *)puVar2," which has already been used");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&vertDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_012d1ca6;
            }
LAB_012d1a64:
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &fragDecl,(int *)__k);
          }
        }
        else if (((int)layout._M_dataplus._M_p != -1) ||
                (pUVar32->checkLocation != SHADERSTAGE_NONE)) {
          if ((int)layout._M_dataplus._M_p == iVar22) {
            __k = &uniName;
            iVar18 = std::
                     _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                     find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)&fragDecl,(key_type_conflict *)__k);
            if (iVar18._M_node ==
                (_Base_ptr)&fragDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
            goto LAB_012d1a64;
            puVar2 = &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
                 local_928;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
                 uStack_924;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
            std::operator<<((ostream *)puVar2,"ERROR: expected uniform ");
            std::operator<<((ostream *)puVar2,(string *)&subTypeIter);
            std::operator<<((ostream *)puVar2," in location ");
            std::ostream::operator<<(puVar2,(int)layout._M_dataplus._M_p);
            std::operator<<((ostream *)puVar2," but it has already been used");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012d1ca6:
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)
                       &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
            pcVar17 = "Overlapping uniform location";
          }
          else {
            puVar2 = &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
                 local_928;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
                 uStack_924;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
            std::operator<<((ostream *)puVar2,"ERROR: found uniform ");
            std::operator<<((ostream *)puVar2,(string *)&subTypeIter);
            std::operator<<((ostream *)puVar2," in location ");
            std::ostream::operator<<(puVar2,(int)layout._M_dataplus._M_p);
            std::operator<<((ostream *)puVar2," when it should have been in ");
            std::ostream::operator<<(puVar2,(int)uniName._M_dataplus._M_p);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
            pcVar17 = "Incorrect uniform location";
          }
          tcu::TestContext::setTestResult
                    ((pUVar34->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar17)
          ;
          std::__cxx11::string::~string((string *)&subTypeIter);
          std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                         *)&fragMain.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          goto LAB_012d1cdf;
        }
        std::__cxx11::string::~string((string *)&subTypeIter);
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  ((SubTypeIterator<glu::IsBasicType> *)&declaredStructs,
                   (SubTypeIterator<glu::IsBasicType> *)&fragMain,0);
        iVar13 = iVar13 + 1;
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&declaredStructs._M_t._M_impl.super__Rb_tree_header);
      }
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                    &fragMain.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
      uVar31 = uVar31 + 1;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &fragDecl);
    (**(code **)(lVar25 + 0x1c0))();
    pUVar33 = pUVar34;
    (**(code **)(lVar25 + 0x188))(0x4500);
    (**(code **)(lVar25 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    iVar12 = (*pUVar34->m_renderCtx->_vptr_RenderContext[3])();
    lVar25 = CONCAT44(extraout_var_02,iVar12);
    iVar12 = (**(code **)(lVar25 + 0x780))(program.m_program.m_program);
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ = 0x3f8000003f800000;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ = 0x3f8000003dcccccd;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0xbf8000003f800000;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0x3f8000003dcccccd;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0x3f800000bf800000;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x3f8000003dcccccd;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0xbf800000bf800000;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f8000003dcccccd;
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    indices[3] = 2;
    indices[4] = 1;
    indices[5] = 3;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x0;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    intBuf[0] = 0;
    intBuf[1] = 0;
    intBuf[2] = 0;
    intBuf[3] = 0;
    subType.m_type = TYPE_BASIC;
    subType._4_4_ = 0;
    subType.m_data.array.elementType = (VarType *)0x0;
    uniName._M_dataplus._M_p = (pointer)0x0;
    uniName._M_string_length = 0;
    uniName.field_2._M_allocated_capacity = 0;
    if (iVar12 < 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"posLoc >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                 ,0x224);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar25 + 0x1680))();
    pTVar1 = (TypeComponentVector *)(lVar25 + 0x15e0);
    uVar27 = 0;
    while( true ) {
      this_02 = (_anonymous_namespace_ *)(ulong)uVar27;
      pUVar32 = (uniformList->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar20 = (long)(uniformList->
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar32;
      if ((_anonymous_namespace_ *)(lVar20 / 0x28) <= this_02) break;
      type = pUVar32 + (long)this_02;
      uVar23 = pUVar32[(long)this_02].location;
      glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&subTypeIter,&type->type);
      while( true ) {
        type_02 = &subTypeIter.m_path;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0.0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0;
        bVar10 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                           (&subTypeIter,(SubTypeIterator<glu::IsBasicType> *)&vertDecl);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
        if (!bVar10) break;
        glu::getVarType((VarType *)&structType,&type->type,type_02);
        puVar2 = &vertDecl.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
        Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                  ((string *)&declaredStructs,this_02,(int)type,(VarType *)type_02,path);
        iVar13 = (**(code **)(lVar25 + 0xb48))
                           (program.m_program.m_program,declaredStructs._M_t._M_impl._0_8_);
        DVar11 = glu::getDataTypeScalarType(auStack_940._0_4_);
        pcVar17 = glu::getDataTypeName(DVar11);
        local_928 = getExpectedValue(DVar11,uVar23,pcVar17);
        uVar29 = DVar11 - TYPE_SAMPLER_1D;
        if (uVar29 < 0x1e) {
          uVar31 = uniName._M_string_length - (long)uniName._M_dataplus._M_p;
          iVar22 = (*pUVar33->m_renderCtx->_vptr_RenderContext[3])();
          lVar20 = CONCAT44(extraout_var_03,iVar22);
          sizedFormat = 0;
          if (uVar29 < 0x1a) {
            sizedFormat = *(uint *)(&DAT_018b9690 + (ulong)uVar29 * 4);
          }
          local_958.type = (VarType *)0x0;
          this_00 = (Texture2D *)operator_new(0x70);
          path = (TypeComponentVector *)0x10;
          glu::Texture2D::Texture2D(this_00,pUVar33->m_renderCtx,sizedFormat,0x10,0x10);
          vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
               0.0;
          vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ = 0;
          data._8_4_ = uVar23;
          data.ptr = (Texture2D *)pUVar33;
          data._12_4_ = uVar30;
          de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::assignData
                    ((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)&local_958,
                     data);
          de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~UniqueBase
                    ((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)&vertDecl);
          tcu::Texture2D::allocLevel((Texture2D *)((long)local_958.type + 0x18),0);
          if (((short)sizedFormat == -0x7272) || ((sizedFormat & 0xffff) == 0x8d7c)) {
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
                 (float)(int)local_928;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
                 0;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0;
            tcu::clear((((Texture2D *)((long)local_958.type + 0x18))->super_TextureLevelPyramid).
                       m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(IVec4 *)&vertDecl);
          }
          else {
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
                 local_928;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
                 0;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = 0;
            vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = 0x3f800000;
            tcu::clear((((Texture2D *)((long)local_958.type + 0x18))->super_TextureLevelPyramid).
                       m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&vertDecl);
          }
          uVar31 = uVar31 >> 3;
          (**(code **)(lVar20 + 8))((int)uVar31 + 0x84c0);
          (*(*(_func_int ***)&(local_958.type)->m_type)[2])();
          (**(code **)(lVar20 + 0xb8))(0xde1,*(deUint32 *)((long)local_958.type + 0x68));
          (**(code **)(lVar20 + 0x1360))(0xde1,0x2800,0x2600);
          (**(code **)(lVar20 + 0x1360))(0xde1,0x2801,0x2600);
          dVar14 = (**(code **)(lVar20 + 0x800))();
          glu::checkError(dVar14,"UniformLocationCase: texture upload",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
                          ,0x204);
          local_710 = (Texture2D *)local_958.type;
          local_958.type = (VarType *)0x0;
          std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
          emplace_back<glu::Texture2D*>
                    ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&uniName,&local_710)
          ;
          de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~UniqueBase
                    ((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)&local_958);
          (**(code **)(lVar25 + 0x14f0))(iVar13,uVar31 & 0xffffffff);
          goto switchD_012d2290_caseD_e;
        }
        if (iVar13 < 0) goto switchD_012d2290_caseD_e;
        fragMain.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT44(fragMain.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream._4_4_,local_928);
        intBuf[0] = (int)local_928;
        subType.m_type = (Type)(long)local_928;
        pTVar5 = ((pUVar33->super_TestCase).super_TestNode.m_testCtx)->m_log;
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
             SUB84(pTVar5,0);
        vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_ =
             (undefined4)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
        std::operator<<((ostream *)puVar2,"Set uniform ");
        std::operator<<((ostream *)puVar2,(string *)&declaredStructs);
        std::operator<<((ostream *)puVar2," in location ");
        std::ostream::operator<<(puVar2,iVar13);
        std::operator<<((ostream *)puVar2," to ");
        std::ostream::operator<<(puVar2,local_928);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&vertDecl,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
        if (0x25 < auStack_940._0_4_ - TYPE_FLOAT) goto switchD_012d2290_caseD_e;
        pVVar24 = (VarType *)&fragMain;
        puVar21 = (undefined8 *)(lVar25 + 0x14e8);
        path = pTVar1;
        switch(auStack_940._0_4_) {
        case 1:
          goto switchD_012d2290_caseD_1;
        case 2:
          puVar21 = (undefined8 *)(lVar25 + 0x1528);
          goto switchD_012d2290_caseD_1;
        case 3:
          puVar21 = (undefined8 *)(lVar25 + 0x1568);
          goto switchD_012d2290_caseD_1;
        case 4:
          puVar21 = (undefined8 *)(lVar25 + 0x15a8);
          goto switchD_012d2290_caseD_1;
        case 5:
          break;
        case 6:
          path = (TypeComponentVector *)(lVar25 + 0x15f0);
          break;
        case 7:
          path = (TypeComponentVector *)(lVar25 + 0x1600);
          break;
        case 8:
          path = (TypeComponentVector *)(lVar25 + 0x1620);
          break;
        case 9:
          path = (TypeComponentVector *)(lVar25 + 0x1610);
          break;
        case 10:
          path = (TypeComponentVector *)(lVar25 + 0x1630);
          break;
        case 0xb:
          path = (TypeComponentVector *)(lVar25 + 0x1650);
          break;
        case 0xc:
          path = (TypeComponentVector *)(lVar25 + 0x1660);
          break;
        case 0xd:
          path = (TypeComponentVector *)(lVar25 + 0x1640);
          break;
        default:
          goto switchD_012d2290_caseD_e;
        case 0x1b:
        case 0x23:
          puVar21 = (undefined8 *)(lVar25 + 0x14f8);
          goto LAB_012d23c1;
        case 0x1c:
        case 0x24:
          puVar21 = (undefined8 *)(lVar25 + 0x1538);
          goto LAB_012d23c1;
        case 0x1d:
        case 0x25:
          puVar21 = (undefined8 *)(lVar25 + 0x1578);
          goto LAB_012d23c1;
        case 0x1e:
        case 0x26:
          puVar21 = (undefined8 *)(lVar25 + 0x15b8);
LAB_012d23c1:
          pVVar24 = (VarType *)intBuf;
          goto switchD_012d2290_caseD_1;
        case 0x1f:
          puVar21 = (undefined8 *)(lVar25 + 0x1508);
          goto LAB_012d247b;
        case 0x20:
          puVar21 = (undefined8 *)(lVar25 + 0x1548);
          goto LAB_012d247b;
        case 0x21:
          puVar21 = (undefined8 *)(lVar25 + 0x1588);
          goto LAB_012d247b;
        case 0x22:
          puVar21 = (undefined8 *)(lVar25 + 0x15c8);
LAB_012d247b:
          pVVar24 = &subType;
switchD_012d2290_caseD_1:
          (*(code *)*puVar21)(iVar13,1,pVVar24);
          goto switchD_012d2290_caseD_e;
        }
        (*(code *)(path->
                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>)
                  ._M_impl.super__Vector_impl_data._M_start)(iVar13,1,0,&fragMain);
switchD_012d2290_caseD_e:
        std::__cxx11::string::~string((string *)&declaredStructs);
        glu::VarType::~VarType((VarType *)&structType);
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  ((SubTypeIterator<glu::IsBasicType> *)&layout,&subTypeIter,0);
        uVar23 = uVar23 - ((int)~uVar23 >> 0x1f);
        std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        ~_Vector_base((_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *
                      )&layout._M_string_length);
      }
      std::_Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      ~_Vector_base(&type_02->
                     super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   );
      uVar27 = uVar27 + 1;
    }
    (**(code **)(lVar25 + 0x610))(iVar12,0x28,lVar20 % 0x28);
    (**(code **)(lVar25 + 0x19f0))(iVar12,4,0x1406,0,0,&fragDecl);
    (**(code **)(lVar25 + 0x568))(4,6,0x1403,indices);
    (**(code **)(lVar25 + 0x518))(iVar12);
    lVar25 = 0;
    while( true ) {
      if ((int)(uniName._M_string_length - (long)uniName._M_dataplus._M_p >> 3) <= lVar25) break;
      if (*(long **)(uniName._M_dataplus._M_p + lVar25 * 8) != (long *)0x0) {
        (**(code **)(**(long **)(uniName._M_dataplus._M_p + lVar25 * 8) + 8))();
      }
      lVar25 = lVar25 + 1;
    }
    std::_Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::~_Vector_base
              ((_Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)&uniName);
    iVar12 = viewport.x;
    context = pUVar33->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&vertDecl,&rendered);
    glu::readPixels(context,iVar12,viewport.y,(PixelBufferAccess *)&vertDecl);
    tcu::Surface::getAccess((PixelBufferAccess *)&vertDecl,&rendered);
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3dcccccd3dcccccd;
    fragDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3dcccccd3dcccccd;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f8000003f800000;
    fragMain.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f8000003f800000;
    for (iVar12 = 0;
        iVar12 < (int)vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
        iVar12 = iVar12 + 1) {
      iVar13 = 0;
      while (iVar13 < (int)vertDecl.super_basic_ostream<char,_std::char_traits<char>_>._8_4_) {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&layout,(int)&vertDecl,iVar13,iVar12);
        tcu::operator-((tcu *)&declaredStructs,(Vector<float,_4> *)&layout,
                       (Vector<float,_4> *)&fragMain);
        tcu::abs<float,4>((tcu *)&subTypeIter,(Vector<float,_4> *)&declaredStructs);
        tcu::lessThanEqual<float,4>
                  ((tcu *)&declaredStructs,(Vector<float,_4> *)&subTypeIter,
                   (Vector<float,_4> *)&fragDecl);
        bVar10 = tcu::boolAll<4>((Vector<bool,_4> *)&declaredStructs);
        iVar13 = iVar13 + 1;
        if (!bVar10) {
          pcVar17 = "Shader produced incorrect result";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_012d2692;
        }
      }
    }
    pcVar17 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
LAB_012d2692:
    tcu::TestContext::setTestResult
              ((pUVar33->super_TestCase).super_TestNode.m_testCtx,testResult,pcVar17);
  }
  tcu::Surface::~Surface(&rendered);
  glu::ShaderProgram::~ShaderProgram(&program);
  glu::ProgramSources::~ProgramSources(&sources);
  return extraout_EAX;
}

Assistant:

UniformLocationCase::IterateResult UniformLocationCase::run (const vector<UniformInfo>& uniformList)
{
	using gls::TextureTestUtil::RandomViewport;

	const glu::ProgramSources	sources		= genShaderSources(uniformList);
	const glu::ShaderProgram	program		(m_renderCtx, sources);
	const int					baseSeed	= m_testCtx.getCommandLine().getBaseSeed();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	const RandomViewport		viewport	(m_renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()) + baseSeed);

	tcu::Surface				rendered	(RENDER_SIZE, RENDER_SIZE);

	if (!verifyLocations(program, uniformList))
		return STOP;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	render(program, uniformList);

	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	if (!verifyResult(rendered.getAccess()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader produced incorrect result");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}